

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O1

base_learner * cb_explore_setup(options_i *options,vw *all)

{
  uint32_t *location;
  _func_int **pp_Var1;
  undefined8 uVar2;
  int iVar3;
  cb_explore *dat;
  _func_int ***__dest;
  option_group_definition *poVar4;
  typed_option<float> *ptVar5;
  base_learner *l;
  single_learner *base;
  single_learner *psVar6;
  learner<CB_EXPLORE::cb_explore,_example> *plVar7;
  code *predict;
  code *learn;
  size_t ws;
  ulong length;
  bool bVar8;
  size_type __dnew_6;
  option_group_definition new_options;
  size_type __dnew_1;
  size_type __dnew;
  size_type __dnew_2;
  size_type __dnew_4;
  size_type __dnew_3;
  size_type __dnew_5;
  _func_int ***local_6d0;
  _func_int **local_6c8;
  _func_int **local_6c0 [2];
  size_t *local_6b0;
  size_t *local_6a8;
  uint32_t *local_6a0;
  long local_698;
  _func_int ***local_690;
  _func_int **local_688;
  _func_int **local_680 [2];
  _func_int ***local_670;
  _func_int **local_668;
  _func_int **local_660 [2];
  _func_int ***local_650;
  _func_int **local_648;
  _func_int **local_640 [2];
  _func_int ***local_630;
  _func_int **local_628;
  _func_int **local_620 [2];
  _func_int ***local_610;
  _func_int **local_608;
  _func_int **local_600 [2];
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  option_group_definition local_570;
  long *local_538;
  long local_530;
  long local_528 [2];
  string local_518;
  string local_4f8;
  undefined1 local_4d8 [112];
  bool local_468;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_450;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_440;
  undefined1 local_438 [112];
  bool local_3c8;
  ios_base local_3b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3a0;
  typed_option<float> local_2b0;
  undefined1 local_210 [112];
  bool local_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  undefined1 local_170 [112];
  bool local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  typed_option<float> local_d0;
  
  dat = calloc_or_throw<CB_EXPLORE::cb_explore>(1);
  memset(dat,0,0x138);
  local_438._0_8_ = (_func_int **)0x1d;
  local_6d0 = local_6c0;
  local_6d0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_6d0,(ulong)local_438);
  local_6c0[0] = (_func_int **)local_438._0_8_;
  builtin_strncpy((char *)((long)local_6d0 + 0xd),"ndit Exp",8);
  builtin_strncpy((char *)((long)local_6d0 + 0x15),"loration",8);
  *(undefined4 *)local_6d0 = 0x746e6f43;
  builtin_strncpy((char *)((long)local_6d0 + 4),"extu",4);
  *(undefined4 *)(local_6d0 + 1) = 0x42206c61;
  builtin_strncpy((char *)((long)local_6d0 + 0xc),"andi",4);
  local_6c8 = (_func_int **)local_438._0_8_;
  *(char *)((long)local_6d0 + local_438._0_8_) = '\0';
  local_570.m_name._M_dataplus._M_p = (pointer)&local_570.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_570,local_6d0,(char *)(local_438._0_8_ + (long)local_6d0));
  local_570.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_570.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_570.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_6d0 != local_6c0) {
    operator_delete(local_6d0);
  }
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  local_590.field_2._M_allocated_capacity = 0x6f6c7078655f6263;
  local_590.field_2._8_2_ = 0x6572;
  local_590._M_string_length = 10;
  local_590.field_2._M_local_buf[10] = '\0';
  location = &(dat->cbcs).num_actions;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_438,&local_590,location);
  local_3c8 = true;
  local_610 = local_600;
  local_4d8._0_8_ = (_func_int **)0x41;
  __dest = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_610,(ulong)local_4d8);
  uVar2 = local_4d8._0_8_;
  local_600[0] = (_func_int **)local_4d8._0_8_;
  local_610 = __dest;
  memcpy(__dest,"Online explore-exploit for a <k> action contextual bandit problem",0x41);
  local_608 = (_func_int **)uVar2;
  *(undefined1 *)((long)__dest + uVar2) = 0;
  std::__cxx11::string::_M_assign((string *)(local_438 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (&local_570,(typed_option<unsigned_int> *)local_438);
  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  local_5b0.field_2._M_allocated_capacity._0_4_ = 0x73726966;
  local_5b0.field_2._M_allocated_capacity._4_2_ = 0x74;
  local_5b0._M_string_length = 5;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_4d8,&local_5b0,&dat->tau);
  local_468 = true;
  local_630 = local_620;
  local_2b0.super_base_option._vptr_base_option = (_func_int **)0x15;
  local_630 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_630,(ulong)&local_2b0);
  local_620[0] = local_2b0.super_base_option._vptr_base_option;
  *local_630 = (_func_int **)0x737269662d756174;
  local_630[1] = (_func_int **)0x726f6c7078652074;
  builtin_strncpy((char *)((long)local_630 + 0xd),"loration",8);
  local_628 = local_2b0.super_base_option._vptr_base_option;
  *(char *)((long)local_630 + (long)local_2b0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_4d8 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar4,(typed_option<unsigned_long> *)local_4d8);
  local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
  local_5d0.field_2._M_allocated_capacity._0_4_ = 0x69737065;
  local_5d0.field_2._M_allocated_capacity._4_3_ = 0x6e6f6c;
  local_5d0._M_string_length = 7;
  local_5d0.field_2._M_local_buf[7] = '\0';
  local_6a0 = location;
  VW::config::typed_option<float>::typed_option(&local_2b0,&local_5d0,&dat->epsilon);
  local_2b0.super_base_option.m_keep = true;
  ptVar5 = VW::config::typed_option<float>::default_value(&local_2b0,0.05);
  local_650 = local_640;
  local_170._0_8_ = (_func_int **)0x1a;
  local_650 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_650,(ulong)local_170);
  local_640[0] = (_func_int **)local_170._0_8_;
  builtin_strncpy((char *)((long)local_650 + 10),"eedy exp",8);
  builtin_strncpy((char *)((long)local_650 + 0x12),"loration",8);
  *local_650 = (_func_int **)0x2d6e6f6c69737065;
  local_650[1] = (_func_int **)0x6520796465657267;
  local_648 = (_func_int **)local_170._0_8_;
  *(char *)((long)local_650 + local_170._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar4,ptVar5)
  ;
  local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
  local_5f0.field_2._M_allocated_capacity._0_4_ = 0x676162;
  local_5f0._M_string_length = 3;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_170,&local_5f0,&dat->bag_size);
  local_100 = true;
  local_670 = local_660;
  local_210._0_8_ = (_func_int **)0x19;
  local_670 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_670,(ulong)local_210);
  local_660[0] = (_func_int **)local_210._0_8_;
  builtin_strncpy((char *)((long)local_670 + 9),"ased exp",8);
  builtin_strncpy((char *)((long)local_670 + 0x11),"loration",8);
  *local_670 = (_func_int **)0x2d676e6967676162;
  local_670[1] = (_func_int **)0x7865206465736162;
  local_668 = (_func_int **)local_210._0_8_;
  *(char *)((long)local_670 + local_210._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar4,(typed_option<unsigned_long> *)local_170);
  local_4f8.field_2._M_allocated_capacity._0_4_ = 0x65766f63;
  local_4f8.field_2._M_allocated_capacity._4_2_ = 0x72;
  local_4f8._M_string_length = 5;
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_210,&local_4f8,&dat->cover_size);
  local_1a0 = true;
  local_690 = local_680;
  local_d0.super_base_option._vptr_base_option = (_func_int **)0x1e;
  local_690 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_690,(ulong)&local_d0);
  local_680[0] = local_d0.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_690 + 0xe),"ased exp",8);
  builtin_strncpy((char *)((long)local_690 + 0x16),"loration",8);
  *local_690 = (_func_int **)0x6320656e696c6e4f;
  local_690[1] = (_func_int **)0x736162207265766f;
  local_688 = local_d0.super_base_option._vptr_base_option;
  *(char *)((long)local_690 + (long)local_d0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_210 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar4,(typed_option<unsigned_long> *)local_210);
  local_518.field_2._M_allocated_capacity._0_4_ = 0x697370;
  local_518._M_string_length = 3;
  local_6a8 = &dat->cover_size;
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  VW::config::typed_option<float>::typed_option(&local_d0,&local_518,&dat->psi);
  local_d0.super_base_option.m_keep = true;
  local_6b0 = &dat->bag_size;
  ptVar5 = VW::config::typed_option<float>::default_value(&local_d0,1.0);
  local_698 = 0x20;
  local_538 = local_528;
  local_538 = (long *)std::__cxx11::string::_M_create((ulong *)&local_538,(ulong)&local_698);
  local_528[0] = local_698;
  local_538[2] = 0x6620726574656d61;
  local_538[3] = 0x7265766f6320726f;
  *local_538 = 0x6565726761736964;
  local_538[1] = 0x72617020746e656d;
  local_530 = local_698;
  *(char *)((long)local_538 + local_698) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar4,ptVar5);
  if (local_538 != local_528) {
    operator_delete(local_538);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_00306540;
  if (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p);
  }
  if (local_690 != local_680) {
    operator_delete(local_690);
  }
  local_210._0_8_ = &PTR__typed_option_00308ee8;
  if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
  }
  if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p);
  }
  if (local_670 != local_660) {
    operator_delete(local_670);
  }
  local_170._0_8_ = &PTR__typed_option_00308ee8;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
    operator_delete(local_5f0._M_dataplus._M_p);
  }
  if (local_650 != local_640) {
    operator_delete(local_650);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_00306540;
  if (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
    operator_delete(local_5d0._M_dataplus._M_p);
  }
  if (local_630 != local_620) {
    operator_delete(local_630);
  }
  local_4d8._0_8_ = &PTR__typed_option_00308ee8;
  if (local_440._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_440._M_pi);
  }
  if (local_450._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_450._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_4d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p);
  }
  if (local_610 != local_600) {
    operator_delete(local_610);
  }
  local_438._0_8_ = &PTR__typed_option_00308ec8;
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
  }
  if (local_3b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_570);
  pp_Var1 = (_func_int **)(local_438 + 0x10);
  local_438._16_8_ = 0x6f6c7078655f6263;
  local_438._24_2_ = 0x6572;
  local_438._8_8_ = (pointer)0xa;
  local_438[0x1a] = '\0';
  local_438._0_8_ = pp_Var1;
  iVar3 = (*options->_vptr_options_i[1])(options,local_438);
  if ((_func_int **)local_438._0_8_ != pp_Var1) {
    operator_delete((void *)local_438._0_8_);
  }
  if ((char)iVar3 == '\0') {
    plVar7 = (learner<CB_EXPLORE::cb_explore,_example> *)0x0;
  }
  else {
    dat->all = all;
    length = (ulong)(dat->cbcs).num_actions;
    local_438._8_8_ = (pointer)0x2;
    local_438._16_3_ = 0x6263;
    local_438._0_8_ = pp_Var1;
    iVar3 = (*options->_vptr_options_i[1])(options);
    if ((_func_int **)local_438._0_8_ != pp_Var1) {
      operator_delete((void *)local_438._0_8_);
    }
    if ((char)iVar3 == '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_438);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_438 + 0x10));
      local_4d8._16_2_ = 0x6263;
      local_4d8._8_8_ = (pointer)0x2;
      local_4d8[0x12] = 0;
      local_4d8._0_8_ = local_4d8 + 0x10;
      std::__cxx11::stringbuf::str();
      (*options->_vptr_options_i[5])(options,local_4d8,&local_2b0);
      if (local_2b0.super_base_option._vptr_base_option !=
          (_func_int **)&local_2b0.super_base_option.m_name._M_string_length) {
        operator_delete(local_2b0.super_base_option._vptr_base_option);
      }
      if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
        operator_delete((void *)local_4d8._0_8_);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_438);
      std::ios_base::~ios_base(local_3b8);
    }
    all->delete_prediction = ACTION_SCORE::delete_action_scores;
    (dat->cbcs).cb_type = 0;
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    (dat->cbcs).scorer = all->scorer;
    local_438._16_6_ = 0x7265766f63;
    local_438._8_8_ = (pointer)0x5;
    local_438._0_8_ = pp_Var1;
    iVar3 = (*options->_vptr_options_i[1])(options);
    if ((_func_int **)local_438._0_8_ != pp_Var1) {
      operator_delete((void *)local_438._0_8_);
    }
    if ((char)iVar3 == '\0') {
      local_438._16_4_ = 0x676162;
      local_438._8_8_ = (pointer)0x3;
      local_438._0_8_ = pp_Var1;
      iVar3 = (*options->_vptr_options_i[1])(options);
      if ((_func_int **)local_438._0_8_ != pp_Var1) {
        operator_delete((void *)local_438._0_8_);
      }
      if ((char)iVar3 == '\0') {
        local_438._16_6_ = 0x7473726966;
        local_438._8_8_ = (pointer)0x5;
        local_438._0_8_ = pp_Var1;
        iVar3 = (*options->_vptr_options_i[1])();
        if ((_func_int **)local_438._0_8_ != pp_Var1) {
          operator_delete((void *)local_438._0_8_);
        }
        learn = CB_EXPLORE::predict_or_learn_greedy<true>;
        bVar8 = (char)iVar3 != '\0';
        if (bVar8) {
          learn = CB_EXPLORE::predict_or_learn_first<true>;
        }
        predict = CB_EXPLORE::predict_or_learn_greedy<false>;
        if (bVar8) {
          predict = CB_EXPLORE::predict_or_learn_first<false>;
        }
        ws = 1;
      }
      else {
        ws = *local_6b0;
        predict = CB_EXPLORE::predict_or_learn_bag<false>;
        learn = CB_EXPLORE::predict_or_learn_bag<true>;
      }
    }
    else {
      psVar6 = LEARNER::as_singleline<char,char>(all->cost_sensitive);
      dat->cs = (learner<CB_EXPLORE::cb_explore,_example> *)psVar6;
      v_array<COST_SENSITIVE::wclass>::resize(&(dat->second_cs_label).costs,length);
      (dat->second_cs_label).costs._end = (dat->second_cs_label).costs._begin + length;
      (dat->cover_probs)._begin = (float *)0x0;
      (dat->cover_probs)._end = (float *)0x0;
      (dat->cover_probs).end_array = (float *)0x0;
      (dat->cover_probs).erase_count = 0;
      v_array<float>::resize(&dat->cover_probs,length);
      (dat->preds).end_array = (uint *)0x0;
      (dat->preds).erase_count = 0;
      (dat->preds)._begin = (uint *)0x0;
      (dat->preds)._end = (uint *)0x0;
      v_array<unsigned_int>::resize(&dat->preds,dat->cover_size);
      ws = *local_6a8 + 1;
      predict = CB_EXPLORE::predict_or_learn_cover<false>;
      learn = CB_EXPLORE::predict_or_learn_cover<true>;
    }
    plVar7 = LEARNER::learner<CB_EXPLORE::cb_explore,example>::
             init_learner<LEARNER::learner<char,example>>(dat,base,learn,predict,ws,action_probs);
    *(undefined8 *)(plVar7 + 0xb8) = *(undefined8 *)(plVar7 + 0x18);
    *(undefined8 *)(plVar7 + 0xc0) = *(undefined8 *)(plVar7 + 0x20);
    *(code **)(plVar7 + 200) = CB_EXPLORE::finish;
    *(undefined8 *)(plVar7 + 0x58) = *(undefined8 *)(plVar7 + 0x18);
    *(code **)(plVar7 + 0x68) = CB_EXPLORE::finish_example;
    dat = (cb_explore *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_570.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570.m_name._M_dataplus._M_p != &local_570.m_name.field_2) {
    operator_delete(local_570.m_name._M_dataplus._M_p);
  }
  if (dat != (cb_explore *)0x0) {
    free(dat);
  }
  return (base_learner *)plVar7;
}

Assistant:

base_learner* cb_explore_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<cb_explore>();
  option_group_definition new_options("Contextual Bandit Exploration");
  new_options
      .add(make_option("cb_explore", data->cbcs.num_actions)
               .keep()
               .help("Online explore-exploit for a <k> action contextual bandit problem"))
      .add(make_option("first", data->tau).keep().help("tau-first exploration"))
      .add(make_option("epsilon", data->epsilon).keep().default_value(0.05f).help("epsilon-greedy exploration"))
      .add(make_option("bag", data->bag_size).keep().help("bagging-based exploration"))
      .add(make_option("cover", data->cover_size).keep().help("Online cover based exploration"))
      .add(make_option("psi", data->psi).keep().default_value(1.0f).help("disagreement parameter for cover"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("cb_explore"))
    return nullptr;

  data->all = &all;
  uint32_t num_actions = data->cbcs.num_actions;

  if (!options.was_supplied("cb"))
  {
    stringstream ss;
    ss << data->cbcs.num_actions;
    options.insert("cb", ss.str());
  }

  all.delete_prediction = delete_action_scores;
  data->cbcs.cb_type = CB_TYPE_DR;

  single_learner* base = as_singleline(setup_base(options, all));
  data->cbcs.scorer = all.scorer;

  learner<cb_explore, example>* l;
  if (options.was_supplied("cover"))
  {
    data->cs = (learner<cb_explore, example>*)(as_singleline(all.cost_sensitive));
    data->second_cs_label.costs.resize(num_actions);
    data->second_cs_label.costs.end() = data->second_cs_label.costs.begin() + num_actions;
    data->cover_probs = v_init<float>();
    data->cover_probs.resize(num_actions);
    data->preds = v_init<uint32_t>();
    data->preds.resize(data->cover_size);
    l = &init_learner(data, base, predict_or_learn_cover<true>, predict_or_learn_cover<false>, data->cover_size + 1,
        prediction_type::action_probs);
  }
  else if (options.was_supplied("bag"))
    l = &init_learner(data, base, predict_or_learn_bag<true>, predict_or_learn_bag<false>, data->bag_size,
        prediction_type::action_probs);
  else if (options.was_supplied("first"))
    l = &init_learner(
        data, base, predict_or_learn_first<true>, predict_or_learn_first<false>, 1, prediction_type::action_probs);
  else  // greedy
    l = &init_learner(
        data, base, predict_or_learn_greedy<true>, predict_or_learn_greedy<false>, 1, prediction_type::action_probs);

  l->set_finish(finish);
  l->set_finish_example(finish_example);
  return make_base(*l);
}